

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O2

ssize_t __thiscall Pl_TIFFPredictor::write(Pl_TIFFPredictor *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uchar *puVar2;
  iterator iVar3;
  uchar *__first;
  undefined4 in_register_00000034;
  uchar *puVar4;
  const_iterator __position;
  uchar *puVar5;
  
  puVar4 = (uchar *)CONCAT44(in_register_00000034,__fd);
  __position._M_current =
       (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  __first = puVar4;
  puVar5 = puVar4 + (long)((this->cur_row).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                          ((ulong)this->bytes_per_row - (long)__position._M_current));
  while (puVar5 <= (uchar *)((long)__buf + (long)puVar4)) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->cur_row,__position,
               __first,puVar5);
    uVar1 = this->bytes_per_row;
    processRow(this);
    puVar2 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    __first = puVar5;
    puVar5 = puVar5 + uVar1;
    if (__position._M_current != puVar2) {
      (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
      __position._M_current = puVar2;
    }
  }
  iVar3 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->cur_row,
                     __position,__first,(uchar *)((long)__buf + (long)puVar4));
  return (ssize_t)iVar3._M_current;
}

Assistant:

void
Pl_TIFFPredictor::write(unsigned char const* data, size_t len)
{
    auto end = data + len;
    auto row_end = data + (bytes_per_row - cur_row.size());
    while (row_end <= end) {
        // finish off current row
        cur_row.insert(cur_row.end(), data, row_end);
        data = row_end;
        row_end += bytes_per_row;

        processRow();

        // Prepare for next row
        cur_row.clear();
    }

    cur_row.insert(cur_row.end(), data, end);
}